

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_cp_setfromcox(jpc_dec_cp_t *cp,jpc_dec_ccp_t *ccp,jpc_coxcp_t *compparms,int flags)

{
  uint uVar1;
  int local_28;
  int rlvlno;
  int flags_local;
  jpc_coxcp_t *compparms_local;
  jpc_dec_ccp_t *ccp_local;
  jpc_dec_cp_t *cp_local;
  
  if (((flags & 4U) != 0) || ((ccp->flags & 4U) == 0)) {
    ccp->numrlvls = compparms->numdlvls + '\x01';
    uVar1 = JPC_COX_GETCBLKSIZEEXPN((uint)compparms->cblkwidthval);
    ccp->cblkwidthexpn = (uint_fast8_t)uVar1;
    uVar1 = JPC_COX_GETCBLKSIZEEXPN((uint)compparms->cblkheightval);
    ccp->cblkheightexpn = (uint_fast8_t)uVar1;
    ccp->qmfbid = compparms->qmfbid;
    ccp->cblkctx = compparms->cblksty;
    ccp->csty = compparms->csty & 1;
    for (local_28 = 0; local_28 < compparms->numrlvls; local_28 = local_28 + 1) {
      ccp->prcwidthexpns[local_28] = compparms->rlvls[local_28].parwidthval;
      ccp->prcheightexpns[local_28] = compparms->rlvls[local_28].parheightval;
    }
    ccp->flags = flags | 1U | ccp->flags;
  }
  return 0;
}

Assistant:

static int jpc_dec_cp_setfromcox(jpc_dec_cp_t *cp, jpc_dec_ccp_t *ccp,
  jpc_coxcp_t *compparms, int flags)
{
	int rlvlno;

	/* Eliminate compiler warnings about unused variables. */
	(void)cp;

	if ((flags & JPC_COC) || !(ccp->flags & JPC_COC)) {
		ccp->numrlvls = compparms->numdlvls + 1;
		ccp->cblkwidthexpn = JPC_COX_GETCBLKSIZEEXPN(
		  compparms->cblkwidthval);
		ccp->cblkheightexpn = JPC_COX_GETCBLKSIZEEXPN(
		  compparms->cblkheightval);
		ccp->qmfbid = compparms->qmfbid;
		ccp->cblkctx = compparms->cblksty;
		ccp->csty = compparms->csty & JPC_COX_PRT;
		for (rlvlno = 0; rlvlno < compparms->numrlvls; ++rlvlno) {
			ccp->prcwidthexpns[rlvlno] =
			  compparms->rlvls[rlvlno].parwidthval;
			ccp->prcheightexpns[rlvlno] =
			  compparms->rlvls[rlvlno].parheightval;
		}
		ccp->flags |= flags | JPC_CSET;
	}
	return 0;
}